

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

bool __thiscall testing::KilledBySignal::operator()(KilledBySignal *this,int exit_status)

{
  return (exit_status & 0x7fU) == this->signum_ &&
         0x1ffffff < (int)((exit_status & 0x7fU) * 0x1000000 + 0x1000000);
}

Assistant:

bool KilledBySignal::operator()(int exit_status) const {
#  if defined(GTEST_KILLED_BY_SIGNAL_OVERRIDE_)
  {
    bool result;
    if (GTEST_KILLED_BY_SIGNAL_OVERRIDE_(signum_, exit_status, &result)) {
      return result;
    }
  }
#  endif  // defined(GTEST_KILLED_BY_SIGNAL_OVERRIDE_)
  return WIFSIGNALED(exit_status) && WTERMSIG(exit_status) == signum_;
}